

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_buf.c
# Opt level: O0

ares_status_t ares_buf_set_length(ares_buf_t *buf,size_t len)

{
  ares_bool_t aVar1;
  size_t len_local;
  ares_buf_t *buf_local;
  
  if ((buf != (ares_buf_t *)0x0) && (aVar1 = ares_buf_is_const(buf), aVar1 == ARES_FALSE)) {
    if (buf->alloc_buf_len - buf->offset <= len) {
      return ARES_EFORMERR;
    }
    buf->data_len = len + buf->offset;
    return ARES_SUCCESS;
  }
  return ARES_EFORMERR;
}

Assistant:

ares_status_t ares_buf_set_length(ares_buf_t *buf, size_t len)
{
  if (buf == NULL || ares_buf_is_const(buf)) {
    return ARES_EFORMERR; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  if (len >= buf->alloc_buf_len - buf->offset) {
    return ARES_EFORMERR; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  buf->data_len = len + buf->offset;
  return ARES_SUCCESS;
}